

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::CutpoolPropagation::recomputeCapacityThreshold(CutpoolPropagation *this,HighsInt cut)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  HighsDomain *pHVar5;
  HighsCutPool *pHVar6;
  pointer ppVar7;
  pointer piVar8;
  HighsMipSolver *pHVar9;
  HighsMipSolverData *pHVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  pHVar5 = this->domain;
  pHVar6 = this->cutpool;
  ppVar7 = (pHVar6->matrix_).ARrange_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (pHVar6->matrix_).ARindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = ppVar7[cut].first;
  lVar15 = (long)iVar3;
  iVar4 = *(int *)((long)(ppVar7 + cut) + 4);
  pHVar9 = pHVar5->mipsolver;
  pHVar10 = (pHVar9->mipdata_)._M_t.
            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t
            .super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
            super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  dVar16 = -pHVar10->feastol;
  pdVar11 = (pHVar6->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12[cut] = dVar16;
  if (iVar3 < iVar4) {
    pdVar13 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar3 = piVar8[lVar15];
      dVar17 = pdVar14[iVar3];
      dVar1 = pdVar13[iVar3];
      if ((dVar17 != dVar1) || (NAN(dVar17) || NAN(dVar1))) {
        dVar2 = pHVar10->feastol;
        dVar18 = dVar2;
        if ((pHVar9->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] == kContinuous) {
          dVar19 = (dVar17 - dVar1) * 0.3;
          dVar18 = dVar2 * 1000.0;
          if (dVar2 * 1000.0 <= dVar19) {
            dVar18 = dVar19;
          }
        }
        dVar17 = ((dVar17 - dVar1) - dVar18) * ABS(pdVar11[lVar15]);
        if (dVar17 <= dVar16) {
          dVar17 = dVar16;
        }
        dVar16 = dVar2;
        if (dVar2 <= dVar17) {
          dVar16 = dVar17;
        }
        pdVar12[cut] = dVar16;
      }
      lVar15 = lVar15 + 1;
    } while (iVar4 != lVar15);
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::recomputeCapacityThreshold(HighsInt cut) {
  HighsInt start = cutpool->getMatrix().getRowStart(cut);
  HighsInt end = cutpool->getMatrix().getRowEnd(cut);
  const HighsInt* arindex = cutpool->getMatrix().getARindex();
  const double* arvalue = cutpool->getMatrix().getARvalue();
  capacityThreshold_[cut] = -domain->feastol();
  for (HighsInt i = start; i < end; ++i) {
    if (domain->col_upper_[arindex[i]] == domain->col_lower_[arindex[i]])
      continue;

    double threshold =
        std::fabs(arvalue[i]) * boundRange(domain->col_upper_[arindex[i]],
                                           domain->col_lower_[arindex[i]],
                                           domain->feastol(),
                                           domain->variableType(arindex[i]));

    capacityThreshold_[cut] =
        std::max({capacityThreshold_[cut], threshold, domain->feastol()});
  }
}